

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall
cs::statement_break::statement_break(statement_break *this,context_t *c,token_base *ptr)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_0037e2d0;
  local_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  (this->super_statement_base).line_num = ptr->line_num;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_0037ef38;
  return;
}

Assistant:

statement_break(context_t c, token_base *ptr) : statement_base(std::move(c), ptr) {}